

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGuiListClipper_SortAndFuseRanges(ImVector<ImGuiListClipperRange> *ranges,int offset)

{
  int iVar1;
  int iVar2;
  ImGuiListClipperRange *pIVar3;
  ImGuiListClipperRange *b;
  int in_ESI;
  ImVector<ImGuiListClipperRange> *in_RDI;
  int i_1;
  int i;
  int sort_end;
  int iVar4;
  int iVar5;
  int local_18;
  int local_14;
  int local_10;
  
  if (1 < in_RDI->Size - in_ESI) {
    local_10 = in_RDI->Size - in_ESI;
    while (local_10 = local_10 + -1, local_14 = in_ESI, 0 < local_10) {
      for (; local_14 < local_10 + in_ESI; local_14 = local_14 + 1) {
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_14);
        iVar5 = pIVar3->Min;
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_14 + 1);
        if (pIVar3->Min < iVar5) {
          pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_14);
          b = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_14 + 1);
          ImSwap<ImGuiListClipperRange>(pIVar3,b);
        }
      }
    }
    for (local_18 = in_ESI + 1; local_18 < in_RDI->Size; local_18 = local_18 + 1) {
      pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18 + -1);
      iVar5 = pIVar3->Max;
      pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18);
      if (pIVar3->Min <= iVar5) {
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18 + -1);
        iVar4 = pIVar3->Min;
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18);
        iVar1 = ImMin<int>(iVar4,pIVar3->Min);
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18 + -1);
        pIVar3->Min = iVar1;
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18 + -1);
        iVar4 = pIVar3->Max;
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18);
        iVar2 = ImMax<int>(iVar4,pIVar3->Max);
        pIVar3 = ImVector<ImGuiListClipperRange>::operator[](in_RDI,local_18 + -1);
        pIVar3->Max = iVar2;
        ImVector<ImGuiListClipperRange>::erase
                  ((ImVector<ImGuiListClipperRange> *)CONCAT44(iVar5,iVar2),
                   (ImGuiListClipperRange *)CONCAT44(iVar4,iVar1));
        local_18 = local_18 + -1;
      }
    }
  }
  return;
}

Assistant:

static void ImGuiListClipper_SortAndFuseRanges(ImVector<ImGuiListClipperRange>& ranges, int offset = 0)
{
    if (ranges.Size - offset <= 1)
        return;

    // Helper to order ranges and fuse them together if possible (bubble sort is fine as we are only sorting 2-3 entries)
    for (int sort_end = ranges.Size - offset - 1; sort_end > 0; --sort_end)
        for (int i = offset; i < sort_end + offset; ++i)
            if (ranges[i].Min > ranges[i + 1].Min)
                ImSwap(ranges[i], ranges[i + 1]);

    // Now fuse ranges together as much as possible.
    for (int i = 1 + offset; i < ranges.Size; i++)
    {
        IM_ASSERT(!ranges[i].PosToIndexConvert && !ranges[i - 1].PosToIndexConvert);
        if (ranges[i - 1].Max < ranges[i].Min)
            continue;
        ranges[i - 1].Min = ImMin(ranges[i - 1].Min, ranges[i].Min);
        ranges[i - 1].Max = ImMax(ranges[i - 1].Max, ranges[i].Max);
        ranges.erase(ranges.Data + i);
        i--;
    }
}